

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,StringRef _className,NameAndTags *_nameAndTags,
          SourceLineInfo *_lineInfo)

{
  char *pcVar1;
  pointer pTVar2;
  Tag *pTVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  char cVar8;
  TestCaseProperties TVar9;
  int iVar10;
  long *plVar11;
  char *pcVar12;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> _Var13;
  pointer pTVar14;
  ulong uVar15;
  long *plVar16;
  size_type sVar17;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type sVar18;
  size_type shortened_size;
  ulong uVar19;
  char cVar20;
  ulong uVar21;
  anon_unknown_26 *paVar22;
  StringRef filename;
  StringRef tag;
  StringRef tag_00;
  StringRef tagStr;
  StringRef tagStr_00;
  string __str;
  ReusableStringStream local_b0;
  string local_a0;
  SourceLineInfo *local_80;
  NameAndTags *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  SourceLineInfo *local_60;
  string *local_58;
  NameAndTags local_50;
  
  sVar18 = (_nameAndTags->name).m_size;
  sVar17 = sVar18;
  local_80 = _lineInfo;
  local_78 = _nameAndTags;
  if (sVar18 == 0) {
    uVar19 = (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter + 1;
    cVar20 = '\x01';
    if (9 < uVar19) {
      uVar15 = uVar19;
      cVar8 = '\x04';
      do {
        cVar20 = cVar8;
        if (uVar15 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_00127a90;
        }
        if (uVar15 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_00127a90;
        }
        if (uVar15 < 10000) goto LAB_00127a90;
        bVar4 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar8 = cVar20 + '\x04';
      } while (bVar4);
      cVar20 = cVar20 + '\x01';
    }
LAB_00127a90:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter = uVar19;
    std::__cxx11::string::_M_construct((ulong)&local_a0,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar19);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1fb182);
    local_50.name.m_start = (char *)&local_50.tags;
    plVar16 = plVar11 + 2;
    if ((StringRef *)*plVar11 == (StringRef *)plVar16) {
      local_50.tags.m_start = (char *)*plVar16;
      local_50.tags.m_size = plVar11[3];
    }
    else {
      local_50.name.m_start = (char *)*plVar11;
      local_50.tags.m_start = (char *)*plVar16;
    }
    local_50.name.m_size = plVar11[1];
    *plVar11 = (long)plVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    _nameAndTags = &local_50;
    sVar17 = local_50.name.m_size;
  }
  pcVar1 = (_nameAndTags->name).m_start;
  local_68 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar1,pcVar1 + sVar17);
  if ((sVar18 == 0) && ((StringRef *)local_50.name.m_start != &local_50.tags)) {
    operator_delete(local_50.name.m_start,(ulong)(local_50.tags.m_start + 1));
  }
  (this->className).m_start = _className.m_start;
  (this->className).m_size = _className.m_size;
  local_70 = &(this->backingTags).field_2;
  (this->backingTags)._M_dataplus._M_p = (pointer)local_70;
  (this->backingTags)._M_string_length = 0;
  (this->backingTags).field_2._M_local_buf[0] = '\0';
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar6 = local_80->line;
  (this->lineInfo).file = local_80->file;
  (this->lineInfo).line = sVar6;
  this->properties = None;
  pcVar1 = (local_78->tags).m_start;
  uVar19 = (local_78->tags).m_size;
  paVar22 = (anon_unknown_26 *)local_80->file;
  pcVar12 = (char *)strlen((char *)paVar22);
  filename.m_size = extraout_RDX;
  filename.m_start = pcVar12;
  anon_unknown_26::extractFilenamePart(paVar22,filename);
  local_58 = &this->backingTags;
  std::__cxx11::string::reserve((ulong)&this->backingTags);
  if (uVar19 != 0) {
    local_60 = &this->lineInfo;
    uVar15 = 0;
    uVar21 = 0;
    sVar18 = extraout_RDX_00;
    bVar4 = false;
    do {
      bVar7 = bVar4;
      if ((pcVar1[uVar21] == '[') && (bVar7 = true, uVar15 = uVar21, bVar4)) {
        ReusableStringStream::ReusableStringStream(&local_b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_b0.m_oss,"Found \'[\' inside a tag while registering test case \'",0x34);
        std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
        std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
        operator<<(local_b0.m_oss,local_80);
        std::__cxx11::stringbuf::str();
        throw_domain_error(&local_a0);
      }
      if (pcVar1[uVar21] == ']') {
        if (!bVar7) {
          ReusableStringStream::ReusableStringStream(&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,"Found unmatched \']\' while registering test case \'",0x31);
          std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
          operator<<(local_b0.m_oss,local_80);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&local_a0);
        }
        if (uVar21 <= uVar15) {
          __assert_fail("tagStart < tagEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.cpp"
                        ,0x5f0,
                        "Catch::TestCaseInfo::TestCaseInfo(StringRef, const NameAndTags &, const SourceLineInfo &)"
                       );
        }
        pcVar12 = (char *)(uVar19 - (uVar15 + 1));
        if ((char *)(~uVar15 + uVar21) <= pcVar12) {
          pcVar12 = (char *)(~uVar15 + uVar21);
        }
        paVar22 = (anon_unknown_26 *)(pcVar1 + uVar15 + 1);
        if ((uVar19 <= uVar15 + 1) || (pcVar12 == (char *)0x0)) {
          ReusableStringStream::ReusableStringStream(&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,"Found an empty tag while registering test case \'",0x30);
          std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
          operator<<(local_b0.m_oss,local_80);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&local_a0);
        }
        tag.m_size = sVar18;
        tag.m_start = pcVar12;
        TVar9 = anon_unknown_26::parseSpecialTag(paVar22,tag);
        sVar18 = extraout_RDX_01;
        if ((TVar9 == None) &&
           (iVar10 = isalnum((uint)(byte)*paVar22), sVar18 = extraout_RDX_02, iVar10 == 0)) {
          ReusableStringStream::ReusableStringStream(&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"Tag name: [",0xb);
          std::ostream::write((char *)local_b0.m_oss,(long)paVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,"] is not allowed.\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,
                     "Tag names starting with non alphanumeric characters are reserved\n",0x41);
          operator<<(local_b0.m_oss,local_60);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&local_a0);
        }
        tag_00.m_size = sVar18;
        tag_00.m_start = pcVar12;
        TVar9 = anon_unknown_26::parseSpecialTag(paVar22,tag_00);
        this->properties = this->properties | TVar9;
        if (((char *)0x1 < pcVar12) && (*paVar22 == (anon_unknown_26)0x2e)) {
          pcVar12 = pcVar12 + -1;
          paVar22 = (anon_unknown_26 *)(pcVar1 + uVar15 + 2);
        }
        tagStr.m_size = (size_type)pcVar12;
        tagStr.m_start = (char *)paVar22;
        internalAppendTag(this,tagStr);
        bVar7 = false;
        sVar18 = extraout_RDX_03;
      }
      uVar21 = uVar21 + 1;
      bVar4 = bVar7;
    } while (uVar19 != uVar21);
    if (bVar7) {
      ReusableStringStream::ReusableStringStream(&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_b0.m_oss,"Found an unclosed tag while registering test case \'",0x33);
      std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
      operator<<(local_b0.m_oss,local_80);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a0);
    }
  }
  if ((this->properties & IsHidden) != None) {
    tagStr_00.m_size = 1;
    tagStr_00.m_start = ".";
    internalAppendTag(this,tagStr_00);
  }
  pTVar2 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar14 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar14) {
    uVar19 = (long)pTVar14 - (long)pTVar2 >> 4;
    lVar5 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pTVar2,pTVar14,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pTVar2,pTVar14);
  }
  _Var13 = std::
           __unique<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     ((this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  pTVar3 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((_Var13._M_current != pTVar3) &&
     (pTVar2 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
               super__Vector_impl_data._M_finish,
     pTVar14 = (pointer)((long)_Var13._M_current + ((long)pTVar2 - (long)pTVar3)), pTVar2 != pTVar14
     )) {
    (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar14;
  }
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo(StringRef _className,
                               NameAndTags const& _nameAndTags,
                               SourceLineInfo const& _lineInfo):
        name( _nameAndTags.name.empty() ? makeDefaultName() : _nameAndTags.name ),
        className( _className ),
        lineInfo( _lineInfo )
    {
        StringRef originalTags = _nameAndTags.tags;
        // We need to reserve enough space to store all of the tags
        // (including optional hidden tag and filename tag)
        auto requiredSize = originalTags.size() + sizeOfExtraTags(_lineInfo.file);
        backingTags.reserve(requiredSize);

        // We cannot copy the tags directly, as we need to normalize
        // some tags, so that [.foo] is copied as [.][foo].
        size_t tagStart = 0;
        size_t tagEnd = 0;
        bool inTag = false;
        for (size_t idx = 0; idx < originalTags.size(); ++idx) {
            auto c = originalTags[idx];
            if (c == '[') {
                CATCH_ENFORCE(
                    !inTag,
                    "Found '[' inside a tag while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = true;
                tagStart = idx;
            }
            if (c == ']') {
                CATCH_ENFORCE(
                    inTag,
                    "Found unmatched ']' while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = false;
                tagEnd = idx;
                assert(tagStart < tagEnd);

                // We need to check the tag for special meanings, copy
                // it over to backing storage and actually reference the
                // backing storage in the saved tags
                StringRef tagStr = originalTags.substr(tagStart+1, tagEnd - tagStart - 1);
                CATCH_ENFORCE( !tagStr.empty(),
                               "Found an empty tag while registering test case '"
                                   << _nameAndTags.name << "' at "
                                   << _lineInfo );

                enforceNotReservedTag(tagStr, lineInfo);
                properties |= parseSpecialTag(tagStr);
                // When copying a tag to the backing storage, we need to
                // check if it is a merged hide tag, such as [.foo], and
                // if it is, we need to handle it as if it was [foo].
                if (tagStr.size() > 1 && tagStr[0] == '.') {
                    tagStr = tagStr.substr(1, tagStr.size() - 1);
                }
                // We skip over dealing with the [.] tag, as we will add
                // it later unconditionally and then sort and unique all
                // the tags.
                internalAppendTag(tagStr);
            }
        }
        CATCH_ENFORCE( !inTag,
                       "Found an unclosed tag while registering test case '"
                           << _nameAndTags.name << "' at " << _lineInfo );


        // Add [.] if relevant
        if (isHidden()) {
            internalAppendTag("."_sr);
        }

        // Sort and prepare tags
        std::sort(begin(tags), end(tags));
        tags.erase(std::unique(begin(tags), end(tags)),
                   end(tags));
    }